

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

bool __thiscall
spvtools::val::ValidationState_t::GetMatrixTypeInfo
          (ValidationState_t *this,uint32_t id,uint32_t *num_rows,uint32_t *num_cols,
          uint32_t *column_type,uint32_t *component_type)

{
  Op OVar1;
  uint32_t uVar2;
  Instruction *this_00;
  Instruction *this_01;
  Instruction *vec_inst;
  uint32_t vec_type;
  Instruction *mat_inst;
  uint32_t *component_type_local;
  uint32_t *column_type_local;
  uint32_t *num_cols_local;
  uint32_t *num_rows_local;
  uint32_t id_local;
  ValidationState_t *this_local;
  
  if (id == 0) {
    this_local._7_1_ = false;
  }
  else {
    this_00 = FindDef(this,id);
    if (this_00 == (Instruction *)0x0) {
      __assert_fail("mat_inst",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validation_state.cpp"
                    ,0x48f,
                    "bool spvtools::val::ValidationState_t::GetMatrixTypeInfo(uint32_t, uint32_t *, uint32_t *, uint32_t *, uint32_t *) const"
                   );
    }
    OVar1 = val::Instruction::opcode(this_00);
    if (OVar1 == OpTypeMatrix) {
      uVar2 = val::Instruction::word(this_00,2);
      this_01 = FindDef(this,uVar2);
      if (this_01 == (Instruction *)0x0) {
        __assert_fail("vec_inst",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validation_state.cpp"
                      ,0x494,
                      "bool spvtools::val::ValidationState_t::GetMatrixTypeInfo(uint32_t, uint32_t *, uint32_t *, uint32_t *, uint32_t *) const"
                     );
      }
      OVar1 = val::Instruction::opcode(this_01);
      if (OVar1 != OpTypeVector) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validation_state.cpp"
                      ,0x497,
                      "bool spvtools::val::ValidationState_t::GetMatrixTypeInfo(uint32_t, uint32_t *, uint32_t *, uint32_t *, uint32_t *) const"
                     );
      }
      uVar2 = val::Instruction::word(this_00,3);
      *num_cols = uVar2;
      uVar2 = val::Instruction::word(this_01,3);
      *num_rows = uVar2;
      uVar2 = val::Instruction::word(this_00,2);
      *column_type = uVar2;
      uVar2 = val::Instruction::word(this_01,2);
      *component_type = uVar2;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ValidationState_t::GetMatrixTypeInfo(uint32_t id, uint32_t* num_rows,
                                          uint32_t* num_cols,
                                          uint32_t* column_type,
                                          uint32_t* component_type) const {
  if (!id) return false;

  const Instruction* mat_inst = FindDef(id);
  assert(mat_inst);
  if (mat_inst->opcode() != spv::Op::OpTypeMatrix) return false;

  const uint32_t vec_type = mat_inst->word(2);
  const Instruction* vec_inst = FindDef(vec_type);
  assert(vec_inst);

  if (vec_inst->opcode() != spv::Op::OpTypeVector) {
    assert(0);
    return false;
  }

  *num_cols = mat_inst->word(3);
  *num_rows = vec_inst->word(3);
  *column_type = mat_inst->word(2);
  *component_type = vec_inst->word(2);

  return true;
}